

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

TextureVkImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::TextureVkImpl,Diligent::FixedBlockMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::TextureVkImpl,Diligent::FixedBlockMemoryAllocator> *this,
          FixedBlockMemoryAllocator *CtorArgs,RenderDeviceVkImpl **CtorArgs_1,
          TextureDesc *CtorArgs_2,TextureData **CtorArgs_3)

{
  FixedBlockMemoryAllocator *pFVar1;
  TextureVkImpl *local_48;
  TextureVkImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  TextureData **CtorArgs_local_3;
  TextureDesc *CtorArgs_local_2;
  RenderDeviceVkImpl **CtorArgs_local_1;
  FixedBlockMemoryAllocator *CtorArgs_local;
  MakeNewRCObj<Diligent::TextureVkImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  pFVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (TextureVkImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (TextureVkImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_48 = (TextureVkImpl *)
               RefCountedObject<Diligent::ITextureVk>::operator_new
                         ((RefCountedObject<Diligent::ITextureVk> *)0xf0,(size_t)pFVar1);
    TextureVkImpl::TextureVkImpl
              (local_48,(IReferenceCounters *)pObj,CtorArgs,*CtorArgs_1,CtorArgs_2,*CtorArgs_3);
  }
  else {
    local_48 = (TextureVkImpl *)
               ::new<Diligent::FixedBlockMemoryAllocator>
                         (0xf0,*(FixedBlockMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    TextureVkImpl::TextureVkImpl
              (local_48,(IReferenceCounters *)pObj,CtorArgs,*CtorArgs_1,CtorArgs_2,*CtorArgs_3);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::TextureVkImpl,Diligent::FixedBlockMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_48,*(FixedBlockMemoryAllocator **)this);
  }
  return local_48;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }